

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

void __thiscall flatbuffers::FlatBufferBuilder::~FlatBufferBuilder(FlatBufferBuilder *this)

{
  FlatBufferBuilder *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->vtables_);
  std::
  vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
  ::~vector(&this->offsetbuf_);
  vector_downward::~vector_downward(&this->buf_);
  return;
}

Assistant:

explicit FlatBufferBuilder(uoffset_t initial_size = 1024)
    : buf_(initial_size), minalign_(1), force_defaults_(false) {
    offsetbuf_.reserve(16);  // Avoid first few reallocs.
    vtables_.reserve(16);
    EndianCheck();
    flatbuffer_version_string =
      "FlatBuffers "
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_MAJOR) "."
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_MINOR) "."
      FLATBUFFERS_STRING(FLATBUFFERS_VERSION_REVISION);
  }